

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef52::ReverbState::DoMixRow
               (span<float,_18446744073709551615UL> OutBuffer,
               span<const_float,_18446744073709551615UL> Gains,float *InSamples,size_t InStride)

{
  float fVar1;
  iterator pfVar2;
  iterator pfVar3;
  float *in_R8;
  long in_R9;
  double dVar4;
  float *sample;
  iterator __end3;
  iterator __begin3;
  span<float,_18446744073709551615UL> *__range3;
  float *input;
  float gain;
  iterator __end2;
  iterator __begin2;
  span<const_float,_18446744073709551615UL> *__range2;
  float *in_stack_ffffffffffffff80;
  float *local_70;
  float *local_60;
  float *local_48;
  float *local_28;
  span<const_float,_18446744073709551615UL> local_20;
  span<float,_18446744073709551615UL> local_10;
  
  pfVar2 = al::span<float,_18446744073709551615UL>::begin(&local_10);
  al::span<float,_18446744073709551615UL>::end(&local_10);
  std::fill<float*,float>(in_stack_ffffffffffffff80,pfVar2,(float *)0x1e1f9a);
  local_48 = al::span<const_float,_18446744073709551615UL>::begin(&local_20);
  pfVar3 = al::span<const_float,_18446744073709551615UL>::end(&local_20);
  local_28 = in_R8;
  for (; local_48 != pfVar3; local_48 = local_48 + 1) {
    fVar1 = *local_48;
    local_60 = al::assume_aligned<16ul,float_const>(local_28);
    local_28 = local_28 + in_R9;
    dVar4 = std::fabs((double)(ulong)(uint)fVar1);
    if (1e-05 < SUB84(dVar4,0)) {
      local_70 = al::span<float,_18446744073709551615UL>::begin(&local_10);
      pfVar2 = al::span<float,_18446744073709551615UL>::end(&local_10);
      for (; local_70 != pfVar2; local_70 = local_70 + 1) {
        *local_70 = *local_60 * fVar1 + *local_70;
        local_60 = local_60 + 1;
      }
    }
  }
  return;
}

Assistant:

static void DoMixRow(const al::span<float> OutBuffer, const al::span<const float> Gains,
        const float *InSamples, const size_t InStride)
    {
        std::fill(OutBuffer.begin(), OutBuffer.end(), 0.0f);
        for(const float gain : Gains)
        {
            const float *RESTRICT input{al::assume_aligned<16>(InSamples)};
            InSamples += InStride;

            if(!(std::fabs(gain) > GainSilenceThreshold))
                continue;

            for(float &sample : OutBuffer)
            {
                sample += *input * gain;
                ++input;
            }
        }
    }